

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O2

bool __thiscall axl::io::Ssl::useCertificateFile(Ssl *this,StringRef *fileName,int fileType)

{
  SSL *ssl;
  bool bVar1;
  int result;
  C *file;
  
  ssl = (SSL *)(this->super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).m_h;
  file = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(fileName);
  result = SSL_use_certificate_file(ssl,file,fileType);
  bVar1 = complete(this,result);
  return bVar1;
}

Assistant:

bool
Ssl::useCertificateFile(
	const sl::StringRef& fileName,
	int fileType
) {
	ASSERT(m_h);
	int result = ::SSL_use_certificate_file(m_h, fileName.sz(), fileType);
	return complete(result);
}